

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_test.cpp
# Opt level: O0

bool __thiscall
ReplayInterface::enqueue_create_shader_module
          (ReplayInterface *this,Hash hash,VkShaderModuleCreateInfo *create_info,
          VkShaderModule *module)

{
  bool bVar1;
  VkShaderModule_T *pVVar2;
  VkShaderModuleCreateInfo *local_38;
  Hash recorded_hash;
  VkShaderModule *module_local;
  VkShaderModuleCreateInfo *create_info_local;
  Hash hash_local;
  ReplayInterface *this_local;
  
  recorded_hash = (Hash)module;
  module_local = (VkShaderModule *)create_info;
  create_info_local = (VkShaderModuleCreateInfo *)hash;
  hash_local = (Hash)this;
  bVar1 = Fossilize::Hashing::compute_hash_shader_module(create_info,(Hash *)&local_38);
  if (bVar1) {
    if (local_38 == create_info_local) {
      pVVar2 = fake_handle<VkShaderModule_T*>((uint64_t)create_info_local);
      *(VkShaderModule_T **)recorded_hash = pVVar2;
      this_local._7_1_ =
           Fossilize::StateRecorder::record_shader_module
                     (&this->recorder,*(VkShaderModule *)recorded_hash,
                      (VkShaderModuleCreateInfo *)module_local,0);
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool enqueue_create_shader_module(Hash hash, const VkShaderModuleCreateInfo *create_info, VkShaderModule *module) override
	{
		Hash recorded_hash;
		if (!Hashing::compute_hash_shader_module(*create_info, &recorded_hash))
			return false;
		if (recorded_hash != hash)
			return false;

		*module = fake_handle<VkShaderModule>(hash);
		return recorder.record_shader_module(*module, *create_info);
	}